

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

void set_ar_dr(OPL3 *chip,int slot,int v)

{
  OPL3_SLOT *pOVar1;
  UINT32 local_38;
  UINT32 local_34;
  OPL3_SLOT *SLOT;
  OPL3_CH *CH;
  int v_local;
  int slot_local;
  OPL3 *chip_local;
  
  pOVar1 = chip->P_CH[slot / 2].SLOT + (int)(slot & 1);
  if (v >> 4 == 0) {
    local_34 = 0;
  }
  else {
    local_34 = (v >> 4) * 4 + 0x10;
  }
  pOVar1->ar = local_34;
  if (pOVar1->ar + (uint)pOVar1->ksr < 0x4c) {
    pOVar1->eg_sh_ar = ""[pOVar1->ar + (uint)pOVar1->ksr];
    pOVar1->eg_m_ar = (1 << (pOVar1->eg_sh_ar & 0x1f)) - 1;
    pOVar1->eg_sel_ar = "pppppppppppppppp"[pOVar1->ar + (uint)pOVar1->ksr];
  }
  else {
    pOVar1->eg_sh_ar = '\0';
    pOVar1->eg_m_ar = (1 << (pOVar1->eg_sh_ar & 0x1f)) - 1;
    pOVar1->eg_sel_ar = 'h';
  }
  if ((v & 0xfU) == 0) {
    local_38 = 0;
  }
  else {
    local_38 = (v & 0xfU) * 4 + 0x10;
  }
  pOVar1->dr = local_38;
  pOVar1->eg_sh_dr = ""[pOVar1->dr + (uint)pOVar1->ksr];
  pOVar1->eg_m_dr = (1 << (pOVar1->eg_sh_dr & 0x1f)) - 1;
  pOVar1->eg_sel_dr = "pppppppppppppppp"[pOVar1->dr + (uint)pOVar1->ksr];
  return;
}

Assistant:

INLINE void set_ar_dr(FM_OPL *OPL,int slot,int v)
{
	OPL_CH   *CH   = &OPL->P_CH[slot/2];
	OPL_SLOT *SLOT = &CH->SLOT[slot&1];

	SLOT->ar = (v>>4)  ? 16 + ((v>>4)  <<2) : 0;

	if ((SLOT->ar + SLOT->ksr) < 16+62)
	{
		SLOT->eg_sh_ar  = eg_rate_shift [SLOT->ar + SLOT->ksr ];
		SLOT->eg_sel_ar = eg_rate_select[SLOT->ar + SLOT->ksr ];
	}
	else
	{
		SLOT->eg_sh_ar  = 0;
		SLOT->eg_sel_ar = 13*RATE_STEPS;
	}

	SLOT->dr    = (v&0x0f)? 16 + ((v&0x0f)<<2) : 0;
	SLOT->eg_sh_dr  = eg_rate_shift [SLOT->dr + SLOT->ksr ];
	SLOT->eg_sel_dr = eg_rate_select[SLOT->dr + SLOT->ksr ];
}